

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

string * parse_util::get_token(string *instr,string *open_par)

{
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type pos1;
  size_type pos;
  string *temp;
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  local_28 = std::__cxx11::string::find(local_10,local_18);
  local_30 = std::__cxx11::string::find_first_not_of((char *)local_10,0x1fb95e);
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
  std::__cxx11::string::operator=(in_RDI,local_50);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

string get_token(const string &instr, const string &open_par)
    {
        string temp;

        string::size_type pos = instr.find(open_par);
        string::size_type pos1 = instr.find_first_not_of(" \n");

        temp = instr.substr(pos1, pos - pos1);

        return temp;
    }